

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O0

bool absl::base_internal::LowLevelAlloc::DeleteArena(Arena *arena)

{
  AllocList *ptr;
  ulong length;
  uintptr_t uVar1;
  Arena *pAVar2;
  uintptr_t uVar3;
  uint *puVar4;
  bool bVar5;
  char *absl_raw_logging_internal_basename_5;
  int munmap_result;
  char *absl_raw_logging_internal_basename_4;
  char *absl_raw_logging_internal_basename_3;
  char *absl_raw_logging_internal_basename_2;
  char *absl_raw_logging_internal_basename_1;
  size_t size;
  AllocList *region;
  undefined1 local_b0 [8];
  ArenaLock section;
  char *absl_raw_logging_internal_basename;
  Arena *arena_local;
  
  bVar5 = false;
  if (arena != (Arena *)0x0) {
    pAVar2 = DefaultArena();
    bVar5 = false;
    if (arena != pAVar2) {
      pAVar2 = anon_unknown_0::UnhookedArena();
      bVar5 = arena != pAVar2;
    }
  }
  if (!bVar5) {
    section.arena_ = (Arena *)0x1fa45c;
    raw_logging_internal::RawLog
              (kFatal,"low_level_alloc.cc",0x182,"Check %s failed: %s",
               "arena != nullptr && arena != DefaultArena() && arena != UnhookedArena()",
               "may not delete default arena");
  }
  anon_unknown_0::ArenaLock::ArenaLock((ArenaLock *)local_b0,arena);
  if (arena->allocation_count == 0) {
    while ((arena->freelist).next[0] != (AllocList *)0x0) {
      ptr = (arena->freelist).next[0];
      length = (ptr->header).size;
      (arena->freelist).next[0] = ptr->next[0];
      uVar1 = (ptr->header).magic;
      uVar3 = Magic(0xffffffffb37cc16a,&ptr->header);
      if (uVar1 != uVar3) {
        raw_logging_internal::RawLog
                  (kFatal,"low_level_alloc.cc",0x18e,"Check %s failed: %s",
                   "region->header.magic == Magic(kMagicUnallocated, &region->header)",
                   "bad magic number in DeleteArena()");
      }
      if ((ptr->header).arena != arena) {
        raw_logging_internal::RawLog
                  (kFatal,"low_level_alloc.cc",400,"Check %s failed: %s",
                   "region->header.arena == arena","bad arena pointer in DeleteArena()");
      }
      if (length % arena->pagesize != 0) {
        raw_logging_internal::RawLog
                  (kFatal,"low_level_alloc.cc",0x192,"Check %s failed: %s",
                   "size % arena->pagesize == 0","empty arena has non-page-aligned block size");
      }
      if ((ulong)ptr % arena->pagesize != 0) {
        raw_logging_internal::RawLog
                  (kFatal,"low_level_alloc.cc",0x194,"Check %s failed: %s",
                   "reinterpret_cast<uintptr_t>(region) % arena->pagesize == 0",
                   "empty arena has non-page-aligned block");
      }
      if ((arena->flags & 2) == 0) {
        absl_raw_logging_internal_basename_5._4_4_ = munmap(ptr,length);
      }
      else {
        absl_raw_logging_internal_basename_5._4_4_ = DirectMunmap(ptr,length);
      }
      if (absl_raw_logging_internal_basename_5._4_4_ != 0) {
        puVar4 = (uint *)__errno_location();
        raw_logging_internal::RawLog
                  (kFatal,"low_level_alloc.cc",0x1a6,"LowLevelAlloc::DeleteArena: munmap failed: %d"
                   ,(ulong)*puVar4);
      }
    }
    anon_unknown_0::ArenaLock::Leave((ArenaLock *)local_b0);
    Free(arena);
    arena_local._7_1_ = true;
  }
  else {
    anon_unknown_0::ArenaLock::Leave((ArenaLock *)local_b0);
    arena_local._7_1_ = false;
  }
  anon_unknown_0::ArenaLock::~ArenaLock((ArenaLock *)local_b0);
  return arena_local._7_1_;
}

Assistant:

bool LowLevelAlloc::DeleteArena(Arena *arena) {
  ABSL_RAW_CHECK(
      arena != nullptr && arena != DefaultArena() && arena != UnhookedArena(),
      "may not delete default arena");
  ArenaLock section(arena);
  if (arena->allocation_count != 0) {
    section.Leave();
    return false;
  }
  while (arena->freelist.next[0] != nullptr) {
    AllocList *region = arena->freelist.next[0];
    size_t size = region->header.size;
    arena->freelist.next[0] = region->next[0];
    ABSL_RAW_CHECK(
        region->header.magic == Magic(kMagicUnallocated, &region->header),
        "bad magic number in DeleteArena()");
    ABSL_RAW_CHECK(region->header.arena == arena,
                   "bad arena pointer in DeleteArena()");
    ABSL_RAW_CHECK(size % arena->pagesize == 0,
                   "empty arena has non-page-aligned block size");
    ABSL_RAW_CHECK(reinterpret_cast<uintptr_t>(region) % arena->pagesize == 0,
                   "empty arena has non-page-aligned block");
    int munmap_result;
#ifdef _WIN32
    munmap_result = VirtualFree(region, 0, MEM_RELEASE);
    ABSL_RAW_CHECK(munmap_result != 0,
                   "LowLevelAlloc::DeleteArena: VitualFree failed");
#else
#ifndef ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
    if ((arena->flags & LowLevelAlloc::kAsyncSignalSafe) == 0) {
      munmap_result = munmap(region, size);
    } else {
      munmap_result = base_internal::DirectMunmap(region, size);
    }
#else
    munmap_result = munmap(region, size);
#endif  // ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
    if (munmap_result != 0) {
      ABSL_RAW_LOG(FATAL, "LowLevelAlloc::DeleteArena: munmap failed: %d",
                   errno);
    }
#endif  // _WIN32
  }
  section.Leave();
  arena->~Arena();
  Free(arena);
  return true;
}